

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *other;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  LogFinisher local_6d;
  int local_6c;
  LogMessage local_68;
  
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xd8);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_6d,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar6 = 0;
  local_6c = size;
  do {
    iVar2 = local_6c - uVar6;
    bVar1 = local_6c < (int)uVar6;
    if (iVar2 == 0 || local_6c < (int)uVar6) {
      return true;
    }
    while( true ) {
      sVar4 = write(this->file_,(void *)((ulong)uVar6 + (long)buffer),(long)iVar2);
      iVar3 = (int)sVar4;
      if (-1 < iVar3) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        this->errno_ = *piVar5;
        return false;
      }
    }
    uVar6 = uVar6 + iVar3;
    if (iVar3 == 0) {
      return iVar2 == 0 || bVar1;
    }
  } while( true );
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8_t* buffer_base = reinterpret_cast<const uint8_t*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}